

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indirect_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12e98c::CpuIndirectIndexedTest_isb_indirect_indexed_Test::
CpuIndirectIndexedTest_isb_indirect_indexed_Test
          (CpuIndirectIndexedTest_isb_indirect_indexed_Test *this)

{
  CpuIndirectIndexedTest_isb_indirect_indexed_Test *this_local;
  
  CpuIndirectIndexedTest::CpuIndirectIndexedTest(&this->super_CpuIndirectIndexedTest);
  (this->super_CpuIndirectIndexedTest).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__CpuIndirectIndexedTest_isb_indirect_indexed_Test_003f24f0;
  return;
}

Assistant:

TEST_F(CpuIndirectIndexedTest, isb_indirect_indexed) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.a = 0xE0;
    expected.p = N_FLAG;
    memory_content = 0xF0 - 0x01;
    run_readwrite_instruction_without_pagecrossing(ISB_INDINX, 0xF0);
}